

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

ctrl_t * __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
::control(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          *this)

{
  size_t sVar1;
  
  sVar1 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar1 == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x1017,
                  "ctrl_t *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::control() const [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
                 );
  }
  if (sVar1 != 0) {
    return (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<long>, absl::hash_internal::Hash<long>, std::equal_to<long>, std::allocator<long>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<long>, Hash = absl::hash_internal::Hash<long>, Eq = std::equal_to<long>, Alloc = std::allocator<long>]"
               );
}

Assistant:

ctrl_t* control() const {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    return common().control();
  }